

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

UtcTimeStamp * __thiscall
FIX::SessionState::getCreationTime(UtcTimeStamp *__return_storage_ptr__,SessionState *this)

{
  Locker local_20;
  Locker l;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)this;
  Locker::Locker(&local_20,&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[10])(__return_storage_ptr__);
  Locker::~Locker(&local_20);
  return __return_storage_ptr__;
}

Assistant:

UtcTimeStamp getCreationTime() const EXCEPT ( IOException )
  { Locker l( m_mutex ); return m_pStore->getCreationTime(); }